

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O0

void __thiscall spvtools::opt::LoopUtils::CreateLoopDedicatedExits(LoopUtils *this)

{
  __node_base_ptr *this_00;
  Loop *this_01;
  IRContext *pIVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Analysis AVar5;
  uint32_t uVar6;
  BasicBlock *pBVar7;
  Function *f;
  LoopDescriptor *this_02;
  CFG *this_03;
  DefUseManager *this_04;
  reference puVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  const_iterator __first;
  const_iterator __last;
  Instruction *pIVar10;
  reference pvVar11;
  reference puVar12;
  size_type sVar13;
  reference ppBVar14;
  pair<std::__detail::_Node_iterator<spvtools::opt::BasicBlock_*,_true,_false>,_bool> pVar15;
  _Node_iterator_base<spvtools::opt::BasicBlock_*,_false> local_258;
  Loop *local_250;
  Loop *parent_loop;
  undefined1 local_240;
  BasicBlock *local_238;
  anon_class_32_4_650d5cca local_230;
  function<void_(spvtools::opt::Instruction_*)> local_210;
  undefined1 local_1f0 [8];
  InstructionBuilder builder;
  function<void_(unsigned_int_*)> local_1c0;
  BasicBlock *local_1a0;
  BasicBlock *pred_block;
  const_iterator cStack_190;
  uint32_t exit_pred_id;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_160
  ;
  Uptr local_158;
  type local_150;
  reference local_140;
  BasicBlock *exit;
  iterator local_128;
  undefined1 local_118 [8];
  iterator insert_pt;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *bb_pred;
  BasicBlock *non_dedicate;
  _Node_iterator_base<unsigned_int,_false> _Stack_c8;
  uint32_t non_dedicate_id;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  undefined1 local_a8 [7];
  bool made_change;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  new_loop_exits;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_bb_set;
  Analysis PreservedAnalyses;
  DefUseManager *def_use_mgr;
  CFG *cfg;
  LoopDescriptor *loop_desc;
  Function *function;
  LoopUtils *this_local;
  
  pBVar7 = Loop::GetHeaderBlock(this->loop_);
  f = BasicBlock::GetParent(pBVar7);
  this_02 = IRContext::GetLoopDescriptor(this->context_,f);
  this_03 = IRContext::cfg(this->context_);
  this_04 = IRContext::get_def_use_mgr(this->context_);
  AVar5 = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&new_loop_exits._M_h._M_single_bucket);
  Loop::GetExitBlocks(this->loop_,
                      (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&new_loop_exits._M_h._M_single_bucket);
  std::
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ::unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                   *)local_a8);
  bVar2 = false;
  this_00 = &new_loop_exits._M_h._M_single_bucket;
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)this_00);
  _Stack_c8._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)this_00);
  do {
    bVar3 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xffffffffffffff38);
    if (!bVar3) {
      sVar13 = std::
               unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
               ::size((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                       *)local_a8);
      if (sVar13 == 1) {
        this_01 = this->loop_;
        local_258._M_cur =
             (__node_type *)
             std::
             unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
             ::begin((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      *)local_a8);
        ppBVar14 = std::__detail::_Node_iterator<spvtools::opt::BasicBlock_*,_true,_false>::
                   operator*((_Node_iterator<spvtools::opt::BasicBlock_*,_true,_false> *)&local_258)
        ;
        Loop::SetMergeBlock(this_01,*ppBVar14);
      }
      if (bVar2) {
        pIVar1 = this->context_;
        AVar5 = operator|(AVar5,kAnalysisCFG);
        AVar5 = operator|(AVar5,kAnalysisLoopAnalysis);
        IRContext::InvalidateAnalysesExceptFor(pIVar1,AVar5);
      }
      std::
      unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
      ::~unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                        *)local_a8);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&new_loop_exits._M_h._M_single_bucket);
      return;
    }
    puVar8 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    non_dedicate._4_4_ = *puVar8;
    bb_pred = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              CFG::block(this_03,non_dedicate._4_4_);
    pvVar9 = CFG::preds(this_03,non_dedicate._4_4_);
    __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar9);
    __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar9);
    bVar3 = std::
            all_of<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::__2>
                      ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )__first._M_current,
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )__last._M_current,(anon_class_8_1_8991fb9c)this);
    if (bVar3) {
      pVar15 = std::
               unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
               ::insert((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                         *)local_a8,(value_type *)&bb_pred);
      insert_pt.iterator_._M_current =
           (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *
           )pVar15.first.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur;
    }
    else {
      bVar2 = true;
      _local_118 = Function::begin(f);
      while( true ) {
        local_128 = Function::end(f);
        bVar4 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                          ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_118,
                           &local_128);
        bVar3 = false;
        if (bVar4) {
          pvVar11 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_118);
          bVar3 = pvVar11 != (reference)bb_pred;
        }
        if (!bVar3) break;
        UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                  ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_118);
      }
      _exit = Function::end(f);
      bVar3 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                        ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_118,
                         (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&exit);
      if (!bVar3) {
        __assert_fail("insert_pt != function->end() && \"Basic Block not found\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp"
                      ,0x15f,"void spvtools::opt::LoopUtils::CreateLoopDedicatedExits()");
      }
      pBVar7 = (BasicBlock *)operator_new(0x88);
      pIVar10 = (Instruction *)operator_new(0x70);
      pIVar1 = this->context_;
      uVar6 = IRContext::TakeNextId(this->context_);
      memset(&__range3,0,0x18);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &__range3);
      Instruction::Instruction(pIVar10,pIVar1,OpLabel,0,uVar6,(OperandList *)&__range3);
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&local_160,pIVar10);
      BasicBlock::BasicBlock(pBVar7,&local_160);
      std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>::
      unique_ptr<std::default_delete<spvtools::opt::BasicBlock>,void>
                ((unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>
                  *)&local_158,pBVar7);
      local_150 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::InsertBefore<false>
                            ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_118,
                             &local_158);
      pvVar11 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*(&local_150);
      std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
      ~unique_ptr(&local_158);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_160);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &__range3);
      local_140 = pvVar11;
      BasicBlock::SetParent(pvVar11,f);
      __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar9);
      cStack_190 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar9);
      while (bVar3 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffe70), bVar3) {
        puVar12 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&__end3);
        pred_block._4_4_ = *puVar12;
        bVar3 = Loop::IsInsideLoop(this->loop_,pred_block._4_4_);
        if (bVar3) {
          pBVar7 = CFG::block(this_03,pred_block._4_4_);
          builder._24_8_ = bb_pred;
          local_1a0 = pBVar7;
          std::function<void(unsigned_int*)>::
          function<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::__0,void>
                    ((function<void(unsigned_int*)> *)&local_1c0,
                     (anon_class_16_2_4559d350 *)&builder.preserved_analyses_);
          BasicBlock::ForEachSuccessorLabel(pBVar7,&local_1c0);
          std::function<void_(unsigned_int_*)>::~function(&local_1c0);
          CFG::RegisterBlock(this_03,local_1a0);
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end3);
      }
      pIVar10 = BasicBlock::GetLabelInst(local_140);
      analysis::DefUseManager::AnalyzeInstDefUse(this_04,pIVar10);
      pIVar1 = this->context_;
      pIVar10 = BasicBlock::GetLabelInst(local_140);
      IRContext::set_instr_block(pIVar1,pIVar10,local_140);
      InstructionBuilder::InstructionBuilder
                ((InstructionBuilder *)local_1f0,this->context_,local_140,AVar5);
      uVar6 = BasicBlock::id((BasicBlock *)bb_pred);
      pIVar10 = InstructionBuilder::AddBranch((InstructionBuilder *)local_1f0,uVar6);
      InstructionBuilder::SetInsertPoint((InstructionBuilder *)local_1f0,pIVar10);
      pvVar9 = bb_pred;
      local_230.builder = (InstructionBuilder *)local_1f0;
      local_230.exit = local_140;
      local_230.def_use_mgr = this_04;
      local_230.this = this;
      std::function<void(spvtools::opt::Instruction*)>::
      function<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::__1,void>
                ((function<void(spvtools::opt::Instruction*)> *)&local_210,&local_230);
      BasicBlock::ForEachPhiInst((BasicBlock *)pvVar9,&local_210,false);
      std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_210);
      CFG::RegisterBlock(this_03,local_140);
      uVar6 = BasicBlock::id((BasicBlock *)bb_pred);
      CFG::RemoveNonExistingEdges(this_03,uVar6);
      local_238 = local_140;
      pVar15 = std::
               unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
               ::insert((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                         *)local_a8,&local_238);
      parent_loop = (Loop *)pVar15.first.
                            super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur;
      local_240 = pVar15.second;
      local_250 = LoopDescriptor::operator[](this_02,(BasicBlock *)bb_pred);
      if (local_250 != (Loop *)0x0) {
        Loop::AddBasicBlock(local_250,local_140);
      }
    }
    std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  } while( true );
}

Assistant:

void LoopUtils::CreateLoopDedicatedExits() {
  Function* function = loop_->GetHeaderBlock()->GetParent();
  LoopDescriptor& loop_desc = *context_->GetLoopDescriptor(function);
  CFG& cfg = *context_->cfg();
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  const IRContext::Analysis PreservedAnalyses =
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping;

  // Gathers the set of basic block that are not in this loop and have at least
  // one predecessor in the loop and one not in the loop.
  std::unordered_set<uint32_t> exit_bb_set;
  loop_->GetExitBlocks(&exit_bb_set);

  std::unordered_set<BasicBlock*> new_loop_exits;
  bool made_change = false;
  // For each block, we create a new one that gathers all branches from
  // the loop and fall into the block.
  for (uint32_t non_dedicate_id : exit_bb_set) {
    BasicBlock* non_dedicate = cfg.block(non_dedicate_id);
    const std::vector<uint32_t>& bb_pred = cfg.preds(non_dedicate_id);
    // Ignore the block if all the predecessors are in the loop.
    if (std::all_of(bb_pred.begin(), bb_pred.end(),
                    [this](uint32_t id) { return loop_->IsInsideLoop(id); })) {
      new_loop_exits.insert(non_dedicate);
      continue;
    }

    made_change = true;
    Function::iterator insert_pt = function->begin();
    for (; insert_pt != function->end() && &*insert_pt != non_dedicate;
         ++insert_pt) {
    }
    assert(insert_pt != function->end() && "Basic Block not found");

    // Create the dedicate exit basic block.
    // TODO(1841): Handle id overflow.
    BasicBlock& exit = *insert_pt.InsertBefore(std::unique_ptr<BasicBlock>(
        new BasicBlock(std::unique_ptr<Instruction>(new Instruction(
            context_, spv::Op::OpLabel, 0, context_->TakeNextId(), {})))));
    exit.SetParent(function);

    // Redirect in loop predecessors to |exit| block.
    for (uint32_t exit_pred_id : bb_pred) {
      if (loop_->IsInsideLoop(exit_pred_id)) {
        BasicBlock* pred_block = cfg.block(exit_pred_id);
        pred_block->ForEachSuccessorLabel([non_dedicate, &exit](uint32_t* id) {
          if (*id == non_dedicate->id()) *id = exit.id();
        });
        // Update the CFG.
        // |non_dedicate|'s predecessor list will be updated at the end of the
        // loop.
        cfg.RegisterBlock(pred_block);
      }
    }

    // Register the label to the def/use manager, requires for the phi patching.
    def_use_mgr->AnalyzeInstDefUse(exit.GetLabelInst());
    context_->set_instr_block(exit.GetLabelInst(), &exit);

    InstructionBuilder builder(context_, &exit, PreservedAnalyses);
    // Now jump from our dedicate basic block to the old exit.
    // We also reset the insert point so all instructions are inserted before
    // the branch.
    builder.SetInsertPoint(builder.AddBranch(non_dedicate->id()));
    non_dedicate->ForEachPhiInst(
        [&builder, &exit, def_use_mgr, this](Instruction* phi) {
          // New phi operands for this instruction.
          std::vector<uint32_t> new_phi_op;
          // Phi operands for the dedicated exit block.
          std::vector<uint32_t> exit_phi_op;
          for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
            uint32_t def_id = phi->GetSingleWordInOperand(i);
            uint32_t incoming_id = phi->GetSingleWordInOperand(i + 1);
            if (loop_->IsInsideLoop(incoming_id)) {
              exit_phi_op.push_back(def_id);
              exit_phi_op.push_back(incoming_id);
            } else {
              new_phi_op.push_back(def_id);
              new_phi_op.push_back(incoming_id);
            }
          }

          // Build the new phi instruction dedicated exit block.
          Instruction* exit_phi = builder.AddPhi(phi->type_id(), exit_phi_op);
          // Build the new incoming branch.
          new_phi_op.push_back(exit_phi->result_id());
          new_phi_op.push_back(exit.id());
          // Rewrite operands.
          uint32_t idx = 0;
          for (; idx < new_phi_op.size(); idx++)
            phi->SetInOperand(idx, {new_phi_op[idx]});
          // Remove extra operands, from last to first (more efficient).
          for (uint32_t j = phi->NumInOperands() - 1; j >= idx; j--)
            phi->RemoveInOperand(j);
          // Update the def/use manager for this |phi|.
          def_use_mgr->AnalyzeInstUse(phi);
        });
    // Update the CFG.
    cfg.RegisterBlock(&exit);
    cfg.RemoveNonExistingEdges(non_dedicate->id());
    new_loop_exits.insert(&exit);
    // If non_dedicate is in a loop, add the new dedicated exit in that loop.
    if (Loop* parent_loop = loop_desc[non_dedicate])
      parent_loop->AddBasicBlock(&exit);
  }

  if (new_loop_exits.size() == 1) {
    loop_->SetMergeBlock(*new_loop_exits.begin());
  }

  if (made_change) {
    context_->InvalidateAnalysesExceptFor(
        PreservedAnalyses | IRContext::kAnalysisCFG |
        IRContext::Analysis::kAnalysisLoopAnalysis);
  }
}